

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

ENetListIterator enet_list_move(ENetListIterator position,void *dataFirst,void *dataLast)

{
  ENetListIterator last;
  ENetListIterator first;
  void *dataLast_local;
  void *dataFirst_local;
  ENetListIterator position_local;
  
  **(undefined8 **)((long)dataFirst + 8) = *dataLast;
  *(undefined8 *)(*dataLast + 8) = *(undefined8 *)((long)dataFirst + 8);
  *(_ENetListNode **)((long)dataFirst + 8) = position->previous;
  *(ENetListIterator *)dataLast = position;
  **(undefined8 **)((long)dataFirst + 8) = dataFirst;
  position->previous = (_ENetListNode *)dataLast;
  return (ENetListIterator)dataFirst;
}

Assistant:

ENetListIterator
enet_list_move (ENetListIterator position, void * dataFirst, void * dataLast)
{
   ENetListIterator first = (ENetListIterator) dataFirst,
                    last = (ENetListIterator) dataLast;

   first -> previous -> next = last -> next;
   last -> next -> previous = first -> previous;

   first -> previous = position -> previous;
   last -> next = position;

   first -> previous -> next = first;
   position -> previous = last;
    
   return first;
}